

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

void bgr_555_to_rgb_555(void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy,
                       int width,int height)

{
  ushort *puVar1;
  ushort uVar2;
  ushort *puVar3;
  ushort *puVar4;
  int iVar5;
  long lVar6;
  
  lVar6 = (long)width;
  puVar3 = (ushort *)((long)src + (long)sx * 2 + (long)(sy * src_pitch));
  puVar4 = (ushort *)((long)dst + (long)dx * 2 + (long)(dy * dst_pitch));
  iVar5 = 0;
  if (height < 1) {
    height = 0;
  }
  for (; iVar5 != height; iVar5 = iVar5 + 1) {
    puVar1 = puVar4 + lVar6;
    for (; puVar4 < puVar1; puVar4 = puVar4 + 1) {
      uVar2 = *puVar3;
      *puVar4 = (uVar2 & 0x1f) << 10 | uVar2 & 0x3e0 | uVar2 >> 10 & 0x1f;
      puVar3 = puVar3 + 1;
    }
    puVar3 = puVar3 + (src_pitch / 2 - lVar6);
    puVar4 = puVar4 + (dst_pitch / 2 - lVar6);
  }
  return;
}

Assistant:

static void bgr_555_to_rgb_555(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const uint16_t *src_ptr = (const uint16_t *)((const char *)src + sy * src_pitch);
   uint16_t *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 2 - width;
   int dst_gap = dst_pitch / 2 - width;
   src_ptr += sx;
   dst_ptr += dx;
   for (y = 0; y < height; y++) {
      uint16_t *dst_end = dst_ptr + width;
      while (dst_ptr < dst_end) {
         *dst_ptr = ALLEGRO_CONVERT_BGR_555_TO_RGB_555(*src_ptr);
         dst_ptr++;
         src_ptr++;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}